

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testDefaultOptionalValueZeroIfNotSet(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *pAVar4;
  NeuralNetwork *pNVar5;
  NeuralNetworkLayer *this;
  Tensor *pTVar6;
  StackLayerParams *pSVar7;
  Type *pTVar8;
  ostream *poVar9;
  int iVar10;
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input1");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar4->datatype_ = 0x10020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,2);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input2");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pFVar3->isoptional_ = true;
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar4->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,2);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  pAVar4 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar4->datatype_ = 0x10020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar4,1);
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar5->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar5->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pTVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar6->rank_ = 3;
  pSVar7 = CoreML::Specification::NeuralNetworkLayer::mutable_stack(this);
  pSVar7->axis_ = 2;
  m.specificationversion_ = 5;
  if (m.description_ == (ModelDescription *)0x0) {
    m.description_ = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_
    ;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((m.description_)->input_).super_RepeatedPtrFieldBase,1);
  pFVar3 = pTVar8->type_;
  if (pFVar3 == (FeatureType *)0x0) {
    pFVar3 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
  }
  pAVar4 = CoreML::Specification::FeatureType::multiarraytype(pFVar3);
  iVar10 = 0;
  if ((pAVar4->_oneof_case_[1] == 0x29) && ((pAVar4->defaultOptionalValue_).intdefaultvalue_ != 0))
  {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x125);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,
                             "m.description().input(1).type().multiarraytype().intdefaultvalue() == 0"
                            );
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar10 = 1;
  }
  CoreML::Specification::Model::~Model(&m);
  return iVar10;
}

Assistant:

int testDefaultOptionalValueZeroIfNotSet() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    // Not set default value which should raise error!

    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(5);
    ML_ASSERT(m.description().input(1).type().multiarraytype().intdefaultvalue() == 0);
    return 0;
}